

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O2

void __thiscall ON_3dmView::Default(ON_3dmView *this)

{
  ON_3dmConstructionPlane *this_00;
  view_projection vVar1;
  ON_3dVector OStack_58;
  ON_3dVector local_40;
  
  ON_wString::Destroy(&this->m_name);
  ON_Viewport::operator=(&this->m_vp,&ON_Viewport::DefaultTopViewYUp);
  this_00 = &this->m_cplane;
  ON_3dmConstructionPlane::Default(this_00);
  (this->m_display_mode_id).Data1 = 0;
  (this->m_display_mode_id).Data2 = 0;
  (this->m_display_mode_id).Data3 = 0;
  (this->m_display_mode_id).Data4[0] = '\0';
  (this->m_display_mode_id).Data4[1] = '\0';
  (this->m_display_mode_id).Data4[2] = '\0';
  (this->m_display_mode_id).Data4[3] = '\0';
  (this->m_display_mode_id).Data4[4] = '\0';
  (this->m_display_mode_id).Data4[5] = '\0';
  (this->m_display_mode_id).Data4[6] = '\0';
  (this->m_display_mode_id).Data4[7] = '\0';
  this->m_view_type = model_view_type;
  *(undefined4 *)&(this->m_position).m_wnd_left = 0;
  *(undefined4 *)((long)&(this->m_position).m_wnd_left + 4) = 0;
  *(undefined4 *)&(this->m_position).m_wnd_right = 0;
  *(undefined4 *)((long)&(this->m_position).m_wnd_right + 4) = 0x3ff00000;
  *(undefined4 *)&(this->m_position).m_wnd_top = 0;
  *(undefined4 *)((long)&(this->m_position).m_wnd_top + 4) = 0;
  *(undefined4 *)&(this->m_position).m_wnd_bottom = 0;
  *(undefined4 *)((long)&(this->m_position).m_wnd_bottom + 4) = 0x3ff00000;
  (this->m_position).m_bMaximized = false;
  (this->m_position).m_floating_viewport = '\0';
  (this->m_position).m_reserved_1 = '\0';
  (this->m_position).m_reserved_2 = '\0';
  (this->m_position).m_reserved_3 = '\0';
  vVar1 = ON_Viewport::Projection(&this->m_vp);
  if (vVar1 == parallel_view) {
    ON_Viewport::CameraX(&this->m_vp);
    ON_Viewport::CameraY(&this->m_vp);
    ON_Plane::CreateFromFrame(&this_00->m_plane,(ON_3dPoint *)this_00,&local_40,&OStack_58);
  }
  this->m_bShowConstructionGrid = true;
  this->m_bShowConstructionAxes = true;
  this->m_bShowConstructionZAxis = false;
  this->m_bShowWorldAxes = true;
  ON_3dmViewTraceImage::Default(&this->m_trace_image);
  ON_3dmWallpaperImage::Default(&this->m_wallpaper_image);
  ON_3dmPageSettings::Default(&this->m_page_settings);
  (this->m_named_view_id).Data1 = 0;
  (this->m_named_view_id).Data2 = 0;
  (this->m_named_view_id).Data3 = 0;
  (this->m_named_view_id).Data4[0] = '\0';
  (this->m_named_view_id).Data4[1] = '\0';
  (this->m_named_view_id).Data4[2] = '\0';
  (this->m_named_view_id).Data4[3] = '\0';
  (this->m_named_view_id).Data4[4] = '\0';
  (this->m_named_view_id).Data4[5] = '\0';
  (this->m_named_view_id).Data4[6] = '\0';
  (this->m_named_view_id).Data4[7] = '\0';
  this->m_bLockedProjection = false;
  this->m_dFocalBlurDistance = 100.0;
  this->m_dFocalBlurAperture = 64.0;
  this->m_dFocalBlurJitter = 0.1;
  this->m_uFocalBlurSampleCount = 10;
  this->m_FocalBlurMode = None;
  (this->m_sizeRendering).cx = 0x280;
  (this->m_sizeRendering).cy = 0x1e0;
  return;
}

Assistant:

void ON_3dmView::Default()
{
  m_name.Destroy();

  m_vp = ON_Viewport::DefaultTopViewYUp;

  m_cplane.Default();
  m_display_mode_id = ON_nil_uuid;
  m_view_type = ON::model_view_type;
  m_position.Default();
  if ( m_vp.Projection() == ON::parallel_view ) {
    m_cplane.m_plane.CreateFromFrame( m_cplane.m_plane.origin, m_vp.CameraX(), m_vp.CameraY() );
  }
  m_bShowConstructionGrid = true;
  m_bShowConstructionAxes = true;
  m_bShowWorldAxes = true;
  m_bShowConstructionZAxis = false;

  m_trace_image.Default();
  m_wallpaper_image.Default();

  m_page_settings.Default();

  m_named_view_id = ON_nil_uuid;

  m_bLockedProjection = false;

  m_dFocalBlurDistance = 100.0;
  m_dFocalBlurAperture = 64.0;
  m_dFocalBlurJitter = 0.1;
  m_uFocalBlurSampleCount = 10;
  m_FocalBlurMode = ON_FocalBlurModes::None;
  m_sizeRendering.cx = 640;
  m_sizeRendering.cy = 480;
}